

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

Image * GenImageGradientH(Image *__return_storage_ptr__,int width,int height,Color left,Color right)

{
  char cVar1;
  short sVar5;
  short sVar6;
  short sVar7;
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  ulong uVar12;
  undefined1 auVar13 [13];
  undefined1 auVar14 [16];
  char *pcVar15;
  ulong uVar16;
  char *pcVar17;
  ulong uVar18;
  char *pcVar19;
  short sVar20;
  float fVar21;
  undefined1 auVar24 [16];
  float fVar25;
  char cVar2;
  char cVar3;
  char cVar4;
  undefined4 uVar22;
  undefined6 uVar23;
  
  pcVar15 = (char *)malloc((long)(height * width) << 2);
  auVar14 = _DAT_0015d900;
  if (0 < width) {
    auVar8[0xc] = right.a;
    auVar8._0_12_ = ZEXT712(0);
    uVar12 = (ulong)left._0_2_ & 0xffffffffffff00ff;
    auVar9._8_4_ = 0;
    auVar9._0_8_ = uVar12;
    auVar9[0xc] = left.a;
    auVar10[8] = left.b;
    auVar10._0_8_ = uVar12;
    auVar10[9] = 0;
    auVar10._10_3_ = auVar9._10_3_;
    auVar13._5_8_ = 0;
    auVar13._0_5_ = auVar10._8_5_;
    auVar11[4] = left.g;
    auVar11._0_4_ = (int)uVar12;
    auVar11[5] = 0;
    auVar11._6_7_ = SUB137(auVar13 << 0x40,6);
    uVar16 = 0;
    pcVar17 = pcVar15;
    do {
      if (0 < height) {
        fVar21 = (float)(int)uVar16 / (float)width;
        fVar25 = 1.0 - fVar21;
        auVar24._0_4_ = (int)(fVar21 * (float)((uint)right & 0xff) + fVar25 * (float)(int)uVar12);
        auVar24._4_4_ =
             (int)(fVar21 * (float)((uint)right >> 8 & 0xff) + fVar25 * (float)auVar11._4_4_);
        auVar24._8_4_ =
             (int)(fVar21 * (float)(int)CONCAT32(auVar8._10_3_,(ushort)right.b) +
                  fVar25 * (float)auVar10._8_4_);
        auVar24._12_4_ =
             (int)(fVar21 * (float)(uint3)(auVar8._10_3_ >> 0x10) +
                  fVar25 * (float)(uint3)(auVar9._10_3_ >> 0x10));
        auVar24 = auVar24 & auVar14;
        sVar5 = auVar24._0_2_;
        cVar1 = (0 < sVar5) * (sVar5 < 0x100) * auVar24[0] - (0xff < sVar5);
        sVar5 = auVar24._2_2_;
        sVar20 = CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar24[2] - (0xff < sVar5),cVar1);
        sVar5 = auVar24._4_2_;
        cVar2 = (0 < sVar5) * (sVar5 < 0x100) * auVar24[4] - (0xff < sVar5);
        sVar5 = auVar24._6_2_;
        uVar22 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar24[6] - (0xff < sVar5),
                          CONCAT12(cVar2,sVar20));
        sVar5 = auVar24._8_2_;
        cVar3 = (0 < sVar5) * (sVar5 < 0x100) * auVar24[8] - (0xff < sVar5);
        sVar5 = auVar24._10_2_;
        uVar23 = CONCAT15((0 < sVar5) * (sVar5 < 0x100) * auVar24[10] - (0xff < sVar5),
                          CONCAT14(cVar3,uVar22));
        sVar5 = auVar24._12_2_;
        cVar4 = (0 < sVar5) * (sVar5 < 0x100) * auVar24[0xc] - (0xff < sVar5);
        sVar7 = auVar24._14_2_;
        sVar5 = (short)((uint)uVar22 >> 0x10);
        sVar6 = (short)((uint6)uVar23 >> 0x20);
        sVar7 = (short)(CONCAT17((0 < sVar7) * (sVar7 < 0x100) * auVar24[0xe] - (0xff < sVar7),
                                 CONCAT16(cVar4,uVar23)) >> 0x30);
        uVar18 = (ulong)(uint)height;
        pcVar19 = pcVar17;
        do {
          *pcVar19 = (0 < sVar20) * (sVar20 < 0x100) * cVar1 - (0xff < sVar20);
          pcVar19[1] = (0 < sVar5) * (sVar5 < 0x100) * cVar2 - (0xff < sVar5);
          pcVar19[2] = (0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6);
          pcVar19[3] = (0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7);
          pcVar19 = pcVar19 + (ulong)(uint)width * 4;
          uVar18 = uVar18 - 1;
        } while (uVar18 != 0);
      }
      uVar16 = uVar16 + 1;
      pcVar17 = pcVar17 + 4;
    } while (uVar16 != (uint)width);
  }
  __return_storage_ptr__->data = pcVar15;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageGradientH(int width, int height, Color left, Color right)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));

    for (int i = 0; i < width; i++)
    {
        float factor = (float)i/(float)width;
        for (int j = 0; j < height; j++)
        {
            pixels[j*width + i].r = (int)((float)right.r*factor + (float)left.r*(1.f - factor));
            pixels[j*width + i].g = (int)((float)right.g*factor + (float)left.g*(1.f - factor));
            pixels[j*width + i].b = (int)((float)right.b*factor + (float)left.b*(1.f - factor));
            pixels[j*width + i].a = (int)((float)right.a*factor + (float)left.a*(1.f - factor));
        }
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}